

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> * __thiscall
flatbuffers::Parser::GetIncludedFiles
          (vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  pointer ppVar2;
  allocator<flatbuffers::IncludedFile> local_39;
  _Rb_tree_const_iterator<flatbuffers::IncludedFile> local_38;
  _Rb_tree_const_iterator<flatbuffers::IncludedFile> local_30;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  Parser *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
       ::find(&this->files_included_per_file_,&this->file_being_parsed_);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
       ::end(&this->files_included_per_file_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::vector
              (__return_storage_ptr__);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>
             ::operator->(&local_20);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
         ::cbegin(&ppVar2->second);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>
             ::operator->(&local_20);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
         ::cend(&ppVar2->second);
    std::allocator<flatbuffers::IncludedFile>::allocator(&local_39);
    std::vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>>::
    vector<std::_Rb_tree_const_iterator<flatbuffers::IncludedFile>,void>
              ((vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>> *)
               __return_storage_ptr__,local_30,local_38,&local_39);
    std::allocator<flatbuffers::IncludedFile>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IncludedFile> Parser::GetIncludedFiles() const {
  const auto it = files_included_per_file_.find(file_being_parsed_);
  if (it == files_included_per_file_.end()) { return {}; }

  return { it->second.cbegin(), it->second.cend() };
}